

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::Close(SscWriterGeneric *this,int transportIndex)

{
  pointer ppoVar1;
  __node_base *p_Var2;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> requests;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> local_38;
  
  if (((this->super_SscWriterBase).m_Threading == true) &&
     ((this->m_EndStepThread)._M_id._M_thread != 0)) {
    std::thread::join();
  }
  if ((this->m_WriterDefinitionsLocked == true) && (this->m_ReaderSelectionsLocked == true)) {
    if (0 < (this->super_SscWriterBase).m_CurrentStep) {
      ppoVar1 = (this->m_MpiRequests).
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      MPI_Waitall((ulong)((long)(this->m_MpiRequests).
                                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppoVar1) >> 3,
                  ppoVar1,0);
      ppoVar1 = (this->m_MpiRequests).
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->m_MpiRequests).
          super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppoVar1) {
        (this->m_MpiRequests).
        super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppoVar1;
      }
    }
    *(this->super_SscWriterBase).m_Buffer.m_Buffer = '\x01';
    local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (ompi_request_t **)0x0;
    local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (ompi_request_t **)0x0;
    p_Var2 = &(this->m_AllSendingReaderRanks)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      if (local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::_M_realloc_insert<>
                  (&local_38,
                   (iterator)
                   local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        *local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
         super__Vector_impl_data._M_finish = (ompi_request_t *)0x0;
        local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      MPI_Isend((this->super_SscWriterBase).m_Buffer.m_Buffer,1,&ompi_mpi_char,
                (int)*(size_type *)(p_Var2 + 1),0,(this->super_SscWriterBase).m_StreamComm,
                local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1);
    }
    MPI_Waitall((ulong)((long)local_38.
                              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_38.
                             super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3,
                local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                _M_impl.super__Vector_impl_data._M_start,0);
    if (local_38.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  MPI_Win_free(&this->m_MpiWin);
  SyncWritePattern(this,true);
  return;
}

Assistant:

void SscWriterGeneric::Close(const int transportIndex)
{
    if (m_Threading && m_EndStepThread.joinable())
    {
        m_EndStepThread.join();
    }

    if (m_WriterDefinitionsLocked && m_ReaderSelectionsLocked)
    {
        if (m_CurrentStep > 0)
        {
            MPI_Waitall(static_cast<int>(m_MpiRequests.size()), m_MpiRequests.data(),
                        MPI_STATUSES_IGNORE);
            m_MpiRequests.clear();
        }

        m_Buffer[0] = 1;

        std::vector<MPI_Request> requests;
        for (const auto &i : m_AllSendingReaderRanks)
        {
            requests.emplace_back();
            MPI_Isend(m_Buffer.data(), 1, MPI_CHAR, i.first, 0, m_StreamComm, &requests.back());
        }
        MPI_Waitall(static_cast<int>(requests.size()), requests.data(), MPI_STATUS_IGNORE);
    }
    else
    {
        MPI_Win_free(&m_MpiWin);
        SyncWritePattern(true);
    }
}